

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

Reals __thiscall Omega_h::read_reals_txt(Omega_h *this,istream *stream,LO n,Int ncomps)

{
  Alloc *pAVar1;
  Int IVar2;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  Reals RVar6;
  HostWrite<double> h_a;
  allocator local_89;
  Write<double> local_88;
  Alloc *local_78;
  ulong local_70;
  ulong local_68;
  Write<double> local_60;
  string local_50;
  
  IVar2 = ncomps;
  std::__cxx11::string::string((string *)&local_50,"",&local_89);
  HostWrite<double>::HostWrite((HostWrite<double> *)&local_88,ncomps * n,&local_50);
  local_78 = (Alloc *)this;
  std::__cxx11::string::~string((string *)&local_50);
  local_68 = 0;
  if (0 < ncomps) {
    local_68 = (ulong)(uint)ncomps;
  }
  if (n < 1) {
    n = 0;
  }
  local_70 = (ulong)(uint)n;
  __buf = extraout_RDX;
  for (uVar3 = 0; uVar4 = local_68, uVar3 != local_70; uVar3 = uVar3 + 1) {
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      std::istream::_M_extract<double>((double *)stream);
      __buf = extraout_RDX_00;
    }
  }
  HostWrite<double>::write
            ((HostWrite<double> *)&local_60,(int)&local_88,__buf,
             CONCAT44(in_register_0000000c,IVar2));
  pAVar1 = local_78;
  Read<double>::Read((Read<signed_char> *)local_78,&local_60);
  Write<double>::~Write(&local_60);
  Write<double>::~Write(&local_88);
  RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX_01;
  RVar6.write_.shared_alloc_.alloc = pAVar1;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals read_reals_txt(std::istream& stream, LO n, Int ncomps) {
  auto h_a = HostWrite<Real>(n * ncomps);
  for (LO i = 0; i < n; ++i) {
    for (Int j = 0; j < ncomps; ++j) {
      stream >> h_a[i * ncomps + j];
    }
  }
  return h_a.write();
}